

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

UBool icu_63::calcNameSetsLengths(UErrorCode *pErrorCode)

{
  ushort uVar1;
  bool bVar2;
  int8_t *tokenLengths;
  UBool UVar3;
  uint8_t *lineLimit;
  byte bVar4;
  uint uVar5;
  int32_t i;
  long lVar6;
  int iVar7;
  uint8_t **pLine;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint16_t *tokens;
  uint8_t *tokenStrings;
  uint8_t *line;
  uint16_t lengths [34];
  uint16_t offsets [34];
  uint *puVar17;
  uint8_t **local_100;
  ulong local_f8;
  uint16_t *local_f0;
  int8_t *local_e8;
  long local_e0;
  ulong local_d8;
  uint8_t *local_d0;
  uint16_t local_c8 [40];
  uint16_t local_78 [36];
  ulong uVar8;
  
  if (gMaxNameLength == 0) {
    UVar3 = isDataLoaded(pErrorCode);
    if (UVar3 == '\0') {
      UVar3 = '\0';
    }
    else {
      lVar6 = 0;
      do {
        *(uint *)(gNameSet + (ulong)((byte)"0123456789ABCDEF<>-"[lVar6] >> 5) * 4) =
             *(uint *)(gNameSet + (ulong)((byte)"0123456789ABCDEF<>-"[lVar6] >> 5) * 4) |
             1 << ("0123456789ABCDEF<>-"[lVar6] & 0x1fU);
        puVar17 = uCharNames;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x13);
      iVar9 = *(int *)((long)uCharNames + (ulong)uCharNames[3]);
      if (iVar9 == 0) {
        uVar16 = 0;
      }
      else {
        lVar6 = (long)uCharNames + (ulong)uCharNames[3] + 4;
        uVar16 = 0;
        do {
          if (*(char *)(lVar6 + 8) == '\x01') {
            uVar11 = (ulong)*(byte *)(lVar6 + 9);
            bVar4 = *(byte *)(lVar6 + 0xc + uVar11 * 2);
            if (bVar4 == 0) {
              uVar12 = 0;
            }
            else {
              uVar12 = 0;
              do {
                *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) =
                     *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) | 1 << (bVar4 & 0x1f);
                bVar4 = *(byte *)(lVar6 + uVar11 * 2 + 0xd + uVar12);
                uVar12 = uVar12 + 1;
              } while (bVar4 != 0);
            }
            if (uVar11 != 0) {
              pbVar13 = (byte *)((long)(int)uVar12 + lVar6 + uVar11 * 2 + 0xd);
              uVar14 = 0;
              do {
                uVar1 = *(ushort *)(lVar6 + 0xc + uVar14 * 2);
                uVar8 = 0;
                iVar7 = 0;
                uVar5 = (uint)uVar1;
                if (uVar1 != 0) {
                  do {
                    bVar4 = *pbVar13;
                    uVar15 = 0;
                    if (bVar4 != 0) {
                      uVar15 = 0;
                      do {
                        *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) =
                             *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) | 1 << (bVar4 & 0x1f);
                        bVar4 = pbVar13[uVar15 + 1];
                        uVar15 = uVar15 + 1;
                      } while (bVar4 != 0);
                    }
                    if ((int)uVar8 < (int)uVar15) {
                      uVar8 = uVar15 & 0xffffffff;
                    }
                    iVar7 = (int)uVar8;
                    pbVar13 = pbVar13 + (long)(int)uVar15 + 1;
                    bVar2 = 1 < (int)uVar5;
                    uVar5 = uVar5 - 1;
                  } while (bVar2);
                }
                uVar12 = (ulong)(uint)((int)uVar12 + iVar7);
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar11);
            }
            if ((int)uVar16 < (int)uVar12) {
              uVar16 = uVar12 & 0xffffffff;
            }
          }
          else if (*(char *)(lVar6 + 8) == '\0') {
            lVar10 = 0;
            bVar4 = *(byte *)(lVar6 + 0xc);
            while (bVar4 != 0) {
              *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) =
                   *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) | 1 << (bVar4 & 0x1f);
              pbVar13 = (byte *)(lVar6 + 0xd + lVar10);
              lVar10 = lVar10 + 1;
              bVar4 = *pbVar13;
            }
            uVar5 = (uint)*(byte *)(lVar6 + 9) + (int)lVar10;
            if ((int)uVar16 < (int)uVar5) {
              uVar16 = (ulong)uVar5;
            }
          }
          lVar6 = lVar6 + (ulong)*(ushort *)(lVar6 + 10);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      lVar6 = 0;
      do {
        pbVar13 = (&charCatNames)[lVar6];
        bVar4 = *pbVar13;
        if (bVar4 == 0) {
          uVar5 = 9;
        }
        else {
          lVar10 = 1;
          do {
            *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) =
                 *(uint *)(gNameSet + (bVar4 >> 3 & 0x1c)) | 1 << (bVar4 & 0x1f);
            bVar4 = pbVar13[lVar10];
            lVar10 = lVar10 + 1;
          } while (bVar4 != 0);
          uVar5 = (int)lVar10 + 8;
        }
        if ((int)uVar16 < (int)uVar5) {
          uVar16 = (ulong)uVar5;
        }
        iVar9 = (int)uVar16;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x21);
      uVar11 = (ulong)(ushort)puVar17[4];
      uVar5 = *puVar17;
      local_e8 = (int8_t *)uprv_malloc_63(uVar11);
      if (local_e8 != (int8_t *)0x0) {
        memset(local_e8,0,uVar11);
      }
      uVar1 = *(ushort *)((long)uCharNames + (ulong)uCharNames[1]);
      local_f8 = (ulong)uVar1;
      if (uVar1 != 0) {
        tokens = (uint16_t *)((long)puVar17 + 0x12);
        tokenStrings = (uint8_t *)((ulong)uVar5 + (long)puVar17);
        lVar6 = (long)uCharNames + (ulong)uCharNames[1] + 2;
        local_f0 = tokens;
        local_d8 = uVar11;
        local_d0 = tokenStrings;
        do {
          local_e0 = lVar6;
          lineLimit = expandGroupLengths((uint8_t *)
                                         ((long)uCharNames +
                                         (ulong)uCharNames[2] +
                                         ((long)(int)((uint)*(ushort *)(lVar6 + 2) << 0x10) |
                                         (ulong)*(ushort *)(lVar6 + 4))),local_78,local_c8);
          lVar6 = 0;
          do {
            tokenLengths = local_e8;
            local_100 = (uint8_t **)(lineLimit + local_78[lVar6]);
            if ((ulong)local_c8[lVar6] != 0) {
              pLine = (uint8_t **)((long)local_100 + (ulong)local_c8[lVar6]);
              uVar5 = calcNameSetLength(tokens,(uint16_t)uVar11,tokenStrings,local_e8,
                                        (uint32_t *)&local_100,pLine,lineLimit);
              tokens = local_f0;
              if ((int)uVar16 < (int)uVar5) {
                uVar16 = (ulong)uVar5;
              }
              if ((local_100 != pLine) &&
                 (uVar5 = calcNameSetLength(local_f0,(uint16_t)uVar11,tokenStrings,tokenLengths,
                                            (uint32_t *)&local_100,pLine,lineLimit),
                 uVar11 = local_d8, (int)uVar16 < (int)uVar5)) {
                uVar16 = (ulong)uVar5;
              }
            }
            iVar9 = (int)uVar16;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x20);
          lVar6 = local_e0 + 6;
          iVar7 = (int)local_f8;
          local_f8 = (ulong)(iVar7 - 1);
        } while (1 < iVar7);
      }
      if (local_e8 != (int8_t *)0x0) {
        uprv_free_63(local_e8);
      }
      UVar3 = '\x01';
      gMaxNameLength = iVar9;
    }
    return UVar3;
  }
  return '\x01';
}

Assistant:

static UBool
calcNameSetsLengths(UErrorCode *pErrorCode) {
    static const char extChars[]="0123456789ABCDEF<>-";
    int32_t i, maxNameLength;

    if(gMaxNameLength!=0) {
        return TRUE;
    }

    if(!isDataLoaded(pErrorCode)) {
        return FALSE;
    }

    /* set hex digits, used in various names, and <>-, used in extended names */
    for(i=0; i<(int32_t)sizeof(extChars)-1; ++i) {
        SET_ADD(gNameSet, extChars[i]);
    }

    /* set sets and lengths from algorithmic names */
    maxNameLength=calcAlgNameSetsLengths(0);

    /* set sets and lengths from extended names */
    maxNameLength=calcExtNameSetsLengths(maxNameLength);

    /* set sets and lengths from group names, set global maximum values */
    calcGroupNameSetsLengths(maxNameLength);

    return TRUE;
}